

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall QTextCursor::insertHtml(QTextCursor *this,QString *html)

{
  long lVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  QTextCursor *in_RSI;
  QTextDocument *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentFragment fragment;
  QSharedDataPointer<QTextCursorPrivate> *in_stack_ffffffffffffffd0;
  QTextCursor *this_00;
  QTextDocument *resourceProvider;
  QString *html_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  resourceProvider = in_RDI;
  bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a62bf);
  if ((!bVar2) &&
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_stack_ffffffffffffffd0),
     pQVar3->priv != (QTextDocumentPrivate *)0x0)) {
    html_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RSI;
    QSharedDataPointer<QTextCursorPrivate>::operator->(&in_RSI->d);
    QTextDocumentPrivate::document((QTextDocumentPrivate *)0x7a62ff);
    QTextDocumentFragment::fromHtml(html_00,resourceProvider);
    insertFragment(this_00,(QTextDocumentFragment *)in_RDI);
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursor::insertHtml(const QString &html)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromHtml(html, d->priv->document());
    insertFragment(fragment);
}